

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall
cmDepends::cmDepends(cmDepends *this,cmLocalUnixMakefileGenerator3 *lg,string *targetDir)

{
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_007d6ef8;
  this->LocalGenerator = lg;
  this->Verbose = false;
  this->FileTimeCache = (cmFileTimeCache *)0x0;
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  (this->Language)._M_string_length = 0;
  (this->Language).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->TargetDirectory,(string *)targetDir);
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalUnixMakefileGenerator3* lg, std::string targetDir)
  : LocalGenerator(lg)
  , TargetDirectory(std::move(targetDir))
{
}